

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<unsigned_short,unsigned_short,unsigned_short,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,false,false>
               (unsigned_short *ldata,unsigned_short *rdata,unsigned_short *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ValidityMask *pVVar6;
  ushort uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  ulong uVar9;
  idx_t idx_in_entry;
  ulong uVar10;
  ulong uVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  ulong uVar13;
  unsigned_short *puVar14;
  unsigned_short *puVar15;
  ulong uVar16;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  unsigned_short *local_98;
  _Head_base<0UL,_unsigned_long_*,_false> local_90;
  ValidityMask *local_88;
  unsigned_short *local_80;
  unsigned_short *local_78;
  ulong local_70;
  buffer_ptr<ValidityBuffer> *local_68;
  idx_t local_60;
  unsigned_short *local_58;
  unsigned_short *local_50;
  ulong local_48;
  ulong local_40;
  unsigned_short *local_38;
  
  _Var12._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_80 = ldata;
  local_78 = rdata;
  if (_Var12._M_head_impl == (unsigned_long *)0x0) {
    if (count != 0) {
      _Var12._M_head_impl = (unsigned_long *)0x0;
      uVar10 = 0;
      do {
        uVar7 = ldata[uVar10];
        if (rdata[uVar10] == 0) {
          if (_Var12._M_head_impl == (unsigned_long *)0x0) {
            local_90._M_head_impl =
                 (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,(unsigned_long *)&local_90);
            p_Var5 = p_Stack_a0;
            peVar4 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar4;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var12._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var12._M_head_impl;
            rdata = local_78;
            ldata = local_80;
          }
          bVar3 = (byte)uVar10 & 0x3f;
          _Var12._M_head_impl[uVar10 >> 6] =
               _Var12._M_head_impl[uVar10 >> 6] &
               (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
        }
        else {
          uVar7 = uVar7 / rdata[uVar10];
        }
        result_data[uVar10] = uVar7;
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_70 = count + 0x3f >> 6;
    local_68 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_40 = 0;
    uVar10 = 0;
    local_98 = result_data;
    local_88 = mask;
    local_60 = count;
    do {
      if (_Var12._M_head_impl == (unsigned_long *)0x0) {
        uVar16 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar16 = count;
        }
LAB_010c556c:
        uVar11 = uVar10;
        if (uVar10 < uVar16) {
          do {
            uVar7 = ldata[uVar10];
            if (rdata[uVar10] == 0) {
              if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                local_90._M_head_impl =
                     (unsigned_long *)(mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_a8,(unsigned_long *)&local_90);
                p_Var5 = p_Stack_a0;
                peVar4 = local_a8;
                local_a8 = (element_type *)0x0;
                p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar4;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var5;
                if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                   p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_68);
                _Var12._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var12._M_head_impl;
                rdata = local_78;
                ldata = local_80;
              }
              bVar3 = (byte)uVar10 & 0x3f;
              _Var12._M_head_impl[uVar10 >> 6] =
                   _Var12._M_head_impl[uVar10 >> 6] &
                   (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
            }
            else {
              uVar7 = uVar7 / rdata[uVar10];
            }
            result_data[uVar10] = uVar7;
            uVar10 = uVar10 + 1;
            uVar11 = uVar16;
          } while (uVar16 != uVar10);
        }
      }
      else {
        uVar1 = _Var12._M_head_impl[local_40];
        uVar16 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar16 = count;
        }
        uVar11 = uVar16;
        result_data = local_98;
        if (uVar1 != 0) {
          if (uVar1 == 0xffffffffffffffff) goto LAB_010c556c;
          uVar13 = uVar16 - uVar10;
          uVar11 = uVar10;
          if (uVar10 <= uVar16 && uVar13 != 0) {
            puVar14 = local_98 + uVar10;
            puVar15 = rdata + uVar10;
            local_38 = ldata + uVar10;
            uVar9 = 0;
            local_58 = puVar15;
            local_50 = puVar14;
            local_48 = uVar13;
            do {
              pVVar6 = local_88;
              if ((uVar1 >> (uVar9 & 0x3f) & 1) != 0) {
                uVar7 = local_38[uVar9];
                if (puVar15[uVar9] == 0) {
                  if (_Var12._M_head_impl == (unsigned_long *)0x0) {
                    local_90._M_head_impl =
                         (unsigned_long *)
                         (local_88->super_TemplatedValidityMask<unsigned_long>).capacity;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_a8,(unsigned_long *)&local_90);
                    p_Var5 = p_Stack_a0;
                    peVar4 = local_a8;
                    local_a8 = (element_type *)0x0;
                    p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var2 = (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar4;
                    (pVVar6->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var5;
                    if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
                       p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_68);
                    _Var12._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (local_88->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var12._M_head_impl;
                    rdata = local_78;
                    ldata = local_80;
                    uVar13 = local_48;
                    puVar14 = local_50;
                    puVar15 = local_58;
                    count = local_60;
                  }
                  bVar3 = (byte)(uVar9 + uVar10) & 0x3f;
                  _Var12._M_head_impl[uVar9 + uVar10 >> 6] =
                       _Var12._M_head_impl[uVar9 + uVar10 >> 6] &
                       (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                }
                else {
                  uVar7 = uVar7 / puVar15[uVar9];
                }
                puVar14[uVar9] = uVar7;
              }
              uVar9 = uVar9 + 1;
              mask = local_88;
              uVar11 = uVar16;
              result_data = local_98;
            } while (uVar13 != uVar9);
          }
        }
      }
      local_40 = local_40 + 1;
      uVar10 = uVar11;
    } while (local_40 != local_70);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}